

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O2

DdNode * Cudd_addSetNZ(DdManager *dd,DdNode **f,DdNode **g)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  
  pDVar2 = *f;
  pDVar1 = *g;
  pDVar3 = pDVar2;
  if (((pDVar2 != pDVar1) && (pDVar3 = pDVar1, pDVar2 != dd->zero)) &&
     (pDVar3 = pDVar2, pDVar1 != dd->zero)) {
    pDVar2 = (DdNode *)0x0;
    if (pDVar1->index == 0x7fffffff) {
      pDVar2 = pDVar1;
    }
    return pDVar2;
  }
  return pDVar3;
}

Assistant:

DdNode *
Cudd_addSetNZ(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *F, *G;

    F = *f; G = *g;
    if (F == G) return(F);
    if (F == DD_ZERO(dd)) return(G);
    if (G == DD_ZERO(dd)) return(F);
    if (cuddIsConstant(G)) return(G);
    return(NULL);

}